

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::tydra::Animation>::construct_value
          (storage_t<tinyusdz::tydra::Animation> *this,value_type *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  
  *(storage_t<tinyusdz::tydra::Animation> **)this = this + 0x10;
  pcVar2 = (v->prim_name)._M_dataplus._M_p;
  paVar1 = &(v->prim_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&(v->prim_name).field_2 + 8);
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x18) = uVar3;
  }
  else {
    *(pointer *)this = pcVar2;
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 8) = (v->prim_name)._M_string_length;
  (v->prim_name)._M_dataplus._M_p = (pointer)paVar1;
  (v->prim_name)._M_string_length = 0;
  (v->prim_name).field_2._M_local_buf[0] = '\0';
  *(storage_t<tinyusdz::tydra::Animation> **)(this + 0x20) = this + 0x30;
  pcVar2 = (v->abs_path)._M_dataplus._M_p;
  paVar1 = &(v->abs_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&(v->abs_path).field_2 + 8);
    *(size_type *)(this + 0x30) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x38) = uVar3;
  }
  else {
    *(pointer *)(this + 0x20) = pcVar2;
    *(size_type *)(this + 0x30) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 0x28) = (v->abs_path)._M_string_length;
  (v->abs_path)._M_dataplus._M_p = (pointer)paVar1;
  (v->abs_path)._M_string_length = 0;
  (v->abs_path).field_2._M_local_buf[0] = '\0';
  *(storage_t<tinyusdz::tydra::Animation> **)(this + 0x40) = this + 0x50;
  pcVar2 = (v->display_name)._M_dataplus._M_p;
  paVar1 = &(v->display_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&(v->display_name).field_2 + 8);
    *(size_type *)(this + 0x50) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x58) = uVar3;
  }
  else {
    *(pointer *)(this + 0x40) = pcVar2;
    *(size_type *)(this + 0x50) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 0x48) = (v->display_name)._M_string_length;
  (v->display_name)._M_dataplus._M_p = (pointer)paVar1;
  (v->display_name)._M_string_length = 0;
  (v->display_name).field_2._M_local_buf[0] = '\0';
  tinyusdz::std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)(this + 0x68),
             (_Rb_tree_header *)&(v->channels_map)._M_t._M_impl.super__Rb_tree_header);
  tinyusdz::std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)(this + 0x98),
             (_Rb_tree_header *)&(v->blendshape_weights_map)._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

void construct_value( value_type && v )
    {
        ::new( value_ptr() ) value_type( std::move( v ) );
    }